

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall djb::tab_r::extract_ndf(tab_r *this,brdf *brdf,int res)

{
  vector<float,_std::allocator<float>_> *this_00;
  ulong __n;
  ulong uVar1;
  iterator iVar2;
  pointer pfVar3;
  double dVar4;
  tab_r *ptVar5;
  float *__dest;
  long lVar6;
  pointer pvVar7;
  pointer pvVar8;
  ulong uVar9;
  int j;
  int k;
  int iVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  vector<double,_std::allocator<double>_> v;
  vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_> io;
  matrix km;
  undefined1 local_118 [12];
  float fStack_10c;
  pointer local_108;
  float local_f4;
  brdf *local_f0;
  float local_e4;
  float local_e0;
  float local_dc;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_d8;
  void *local_b8;
  iterator iStack_b0;
  pair<djb::vec3,_djb::vec3> *local_a8;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_98;
  ulong local_78;
  tab_r *local_70;
  ulong local_68;
  double local_60;
  double local_58;
  matrix local_50;
  
  uVar11 = res - 1;
  local_118._0_8_ = (pointer)0x0;
  local_f0 = brdf;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50.mij,(ulong)(uVar11 * uVar11),(value_type_conflict3 *)local_118,
             (allocator_type *)&local_b8);
  local_a8 = (pair<djb::vec3,_djb::vec3> *)0x0;
  local_b8 = (void *)0x0;
  iStack_b0._M_current = (pair<djb::vec3,_djb::vec3> *)0x0;
  local_d8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.size = uVar11;
  if (1 < res) {
    uVar12 = 0;
    do {
      fVar13 = ((float)(int)uVar12 / (float)(int)uVar11) * ((float)(int)uVar12 / (float)(int)uVar11)
               * 3.1415927 * 0.5;
      fVar14 = cosf(fVar13);
      local_118._0_4_ = sinf(fVar13);
      local_118._4_4_ = 0;
      stack0xfffffffffffffef0 = (pointer)CONCAT44(local_118._0_4_,fVar14);
      local_108 = (pointer)((ulong)(uint)fVar14 << 0x20);
      if (iStack_b0._M_current == local_a8) {
        std::vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>::
        _M_realloc_insert<std::pair<djb::vec3,djb::vec3>>
                  ((vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>
                    *)&local_b8,iStack_b0,(pair<djb::vec3,_djb::vec3> *)local_118);
      }
      else {
        *(pointer *)&((iStack_b0._M_current)->second).y = local_108;
        ((iStack_b0._M_current)->first).x = (float_t)local_118._0_4_;
        ((iStack_b0._M_current)->first).y = 0.0;
        *(pointer *)&((iStack_b0._M_current)->first).z = stack0xfffffffffffffef0;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  local_70 = this;
  (*local_f0->_vptr_brdf[3])(&local_98,local_f0,&local_b8,0);
  local_108 = local_d8.
              super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  unique0x100008f4 =
       local_d8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_118._0_8_ =
       local_d8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_98.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_118);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_98);
  local_78 = (ulong)(uint)res;
  if (1 < res) {
    local_f4 = (float)(int)uVar11;
    local_60 = 3.1415927410125732 / (double)(int)uVar11;
    local_68 = (ulong)uVar11;
    uVar9 = 0;
    do {
      fVar13 = (float)(int)uVar9 / local_f4;
      fVar13 = fVar13 * fVar13 * 3.1415927 * 0.5;
      local_e0 = cosf(fVar13);
      local_e4 = sinf(fVar13);
      pvVar7 = local_d8.
               super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = local_d8.
              super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar9]._M_size;
      __n = uVar1 * 4;
      __dest = (float *)operator_new(__n);
      if (pvVar7[uVar9]._M_data != (float *)0x0) {
        memcpy(__dest,pvVar7[uVar9]._M_data,__n);
      }
      fVar13 = *__dest;
      if (uVar1 != 1) {
        lVar6 = 4;
        do {
          fVar13 = fVar13 + *(float *)((long)__dest + lVar6);
          lVar6 = lVar6 + 4;
        } while (__n - lVar6 != 0);
      }
      local_58 = (double)(fVar13 / (float)uVar1) * local_60;
      uVar12 = 0;
      do {
        fVar13 = (float)(int)uVar12 / local_f4;
        local_f0 = (brdf *)CONCAT44(local_f0._4_4_,fVar13);
        fVar14 = fVar13 * fVar13 * 3.1415927 * 0.5;
        fVar13 = cosf(fVar14);
        local_dc = sinf(fVar14);
        fVar14 = local_e4 * local_dc;
        fVar13 = fVar13 * local_e0;
        dVar4 = 0.0;
        iVar10 = 0;
        do {
          fVar15 = cosf(((float)iVar10 / 180.0 + (float)iVar10 / 180.0) * 3.1415927);
          fVar16 = fVar15 * fVar14 + fVar13;
          fVar15 = 0.0;
          if (0.0 <= fVar16) {
            fVar15 = fVar16;
          }
          fVar16 = 1.0;
          if (fVar15 <= 1.0) {
            fVar16 = fVar15;
          }
          dVar4 = dVar4 + (double)fVar16;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0xb4);
        local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(int)(local_50.size * (int)uVar9 + uVar12)] =
             (double)(local_f0._0_4_ * local_dc) * dVar4 * 0.034906586011250816 * local_58;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar11);
      operator_delete(__dest);
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_68);
  }
  matrix::eigenvector((vector<double,_std::allocator<double>_> *)local_118,&local_50,4);
  ptVar5 = local_70;
  uVar9 = local_78;
  if (0 < (int)((ulong)((long)stack0xfffffffffffffef0 - local_118._0_8_) >> 3)) {
    this_00 = &local_70->m_ndf;
    lVar6 = 0;
    pvVar7 = (pointer)local_118._0_8_;
    pvVar8 = stack0xfffffffffffffef0;
    do {
      local_98.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_98.
                             super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (float)(double)(&pvVar7->_M_size)[lVar6]);
      iVar2._M_current =
           (ptVar5->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ptVar5->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (this_00,iVar2,(float *)&local_98);
        pvVar7 = (pointer)local_118._0_8_;
        pvVar8 = stack0xfffffffffffffef0;
      }
      else {
        *iVar2._M_current = (float)(double)(&pvVar7->_M_size)[lVar6];
        (ptVar5->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)((ulong)((long)pvVar8 - (long)pvVar7) >> 3));
  }
  pfVar3 = (ptVar5->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar13 = pfVar3[(long)(int)uVar9 + -2];
  fVar14 = (fVar13 + fVar13) - pfVar3[(long)(int)uVar9 + -3];
  fVar13 = 0.0;
  if (0.0 <= fVar14) {
    fVar13 = fVar14;
  }
  local_98.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_98.
                         super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar13);
  iVar2._M_current =
       (ptVar5->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (ptVar5->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&ptVar5->m_ndf,iVar2,(float *)&local_98);
  }
  else {
    *iVar2._M_current = fVar13;
    (ptVar5->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  fwrite("djb_verbose: NDF extraction complete\n",0x25,1,_stdout);
  if ((pointer)local_118._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._0_8_);
  }
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_d8);
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8);
  }
  if (local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void tab_r::extract_ndf(const brdf &brdf, int res)
{
	const int cnt = res - 1;
	const double du = (double)m_pi() / cnt;
	matrix km(cnt);
	std::vector<brdf::io_pair> io;
	std::vector<brdf::value_type> frp_v;

	// evaluate all directions
	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / (float_t)cnt;
		float_t ti = sqr(u) * m_pi() / 2;
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i, 0, zi);

		io.push_back(brdf::io_pair(wi, wi));
	}
	frp_v = brdf.eval_batch(io);

	// build kernel
	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / cnt;
		float_t ti = sqr(u) * m_pi() / 2;
		float_t zi = cos(ti), z_i = sin(ti);
		brdf::value_type frp = frp_v[i];
		float_t frp_i = frp.sum() / frp.size();//dot(frp, vec3(0.2126, 0.7152, 0.0722));
		double kji_tmp = (double)frp_i * du;

		for (int j = 0; j < cnt; ++j) {
			const int nk = 180;
			const double dk = 2 * (double)m_pi() / nk;
			float_t u = (float_t)j / cnt;
			float_t tm = sqr(u) * m_pi() / 2;
			float_t zm = cos(tm), z_m = sin(tm);
			double nint = 0;

			for (int k = 0; k < nk; ++k) {
				float_t u = (float_t)k / (float_t)nk;
				float_t pm = u * 2 * m_pi();

				nint+= (double)sat(z_i * z_m * cos(pm) + zi * zm);
			}
			nint*= dk;

			km(j, i) = kji_tmp * nint * (double)(u * z_m);
		}
	}

	// compute
	const std::vector<double> v = km.eigenvector(4);
	for (int i = 0; i < (int)v.size(); ++i)
		m_ndf.push_back(v[i]);
	m_ndf.push_back(max((float_t)0, 2 * m_ndf[cnt - 1] - m_ndf[cnt - 2]));

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF extraction complete\n");
#endif
}